

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

void __thiscall tinyusdz::Prim::Prim(Prim *this,Value *rhs)

{
  bool bVar1;
  uint32_t uVar2;
  string *psVar3;
  Value *v;
  allocator local_251;
  string local_250;
  Path local_230;
  allocator local_159;
  string local_158;
  Path local_138;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  undefined1 local_40 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pv;
  Value *rhs_local;
  Prim *this_local;
  
  pv.contained._24_8_ = rhs;
  Path::Path(&this->_abs_path);
  Path::Path(&this->_path);
  Path::Path(&this->_elementPath);
  ::std::__cxx11::string::string((string *)&this->_prim_type_name);
  this->_specifier = Invalid;
  tinyusdz::value::Value::Value(&this->_data);
  ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::vector
            ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)&this->_children);
  ::std::
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::multiset((multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&this->_childrenNameSet);
  this->_child_dirty = false;
  this->_primChildrenIndicesIsValid = false;
  ::std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&this->_primChildrenIndices);
  this->_prim_id = -1;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
         *)&this->_variantSets);
  uVar2 = tinyusdz::value::Value::type_id((Value *)pv.contained._24_8_);
  if ((0x3ff < uVar2) &&
     (uVar2 = tinyusdz::value::Value::type_id((Value *)pv.contained._24_8_), uVar2 < 0x2006)) {
    tinyusdz::value::Value::operator=(&this->_data,(Value *)pv.contained._24_8_);
    GetPrimElementName_abi_cxx11_(&local_68,(tinyusdz *)&this->_data,v);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_40,&local_68);
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional(&local_68);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_40);
    if (bVar1) {
      psVar3 = (string *)
               nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_40);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_158,"",&local_159);
      Path::Path(&local_138,psVar3,&local_158);
      Path::operator=(&this->_path,&local_138);
      Path::~Path(&local_138);
      ::std::__cxx11::string::~string((string *)&local_158);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_159);
      psVar3 = (string *)
               nonstd::optional_lite::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_40);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_250,"",&local_251);
      Path::Path(&local_230,psVar3,&local_250);
      Path::operator=(&this->_elementPath,&local_230);
      Path::~Path(&local_230);
      ::std::__cxx11::string::~string((string *)&local_250);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
    }
    nonstd::optional_lite::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_40);
  }
  return;
}

Assistant:

Prim::Prim(value::Value &&rhs) {
  // Check if type is Prim(Model(GPrim), usdShade, usdLux, etc.)
  if ((value::TypeId::TYPE_ID_MODEL_BEGIN <= rhs.type_id()) &&
      (value::TypeId::TYPE_ID_MODEL_END > rhs.type_id())) {
    _data = std::move(rhs);

    if (auto pv = GetPrimElementName(_data)) {
      _path = Path(pv.value(), "");
      _elementPath = Path(pv.value(), "");
    }

  } else {
    // TODO: Raise an error if rhs is not an Prim
  }
}